

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lh_candidate_index_impl.h
# Opt level: O1

void __thiscall
lh_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  pointer ppVar1;
  pointer ppVar2;
  int iVar3;
  iterator iVar4;
  iterator __begin2;
  __node_base *p_Var5;
  int *piVar6;
  int iVar7;
  pointer ppVar8;
  pair<int,_int> *il_entry;
  pointer __args;
  int pre_cand_id;
  int current_tree_id;
  vector<int,_std::allocator<int>_> pre_candidates;
  vector<int,_std::allocator<int>_> intersection_cnt;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  int local_b0;
  int local_ac;
  int *local_a8;
  iterator iStack_a0;
  int *local_98;
  vector<int,_std::allocator<int>_> local_88;
  double local_70;
  pointer local_68;
  CandidateIndex *local_60;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_58;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *local_50;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_48;
  
  local_70 = distance_threshold;
  local_60 = this;
  local_58 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates;
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&local_48,(long)(il_size + 1),(allocator_type *)&local_88);
  local_ac = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,
             (long)(histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_a8);
  ppVar8 = (histogram_collection->
           super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (histogram_collection->
             super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = histogram_collection;
  if (ppVar8 != local_68) {
    do {
      local_a8 = (int *)0x0;
      iStack_a0._M_current = (int *)0x0;
      local_98 = (int *)0x0;
      if (((double)ppVar8->first <= local_70) && (local_b0 = 0, 0 < local_ac)) {
        do {
          if (iStack_a0._M_current == local_98) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&local_b0);
          }
          else {
            *iStack_a0._M_current = local_b0;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[local_b0] =
               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_b0] + 1;
          local_b0 = local_b0 + 1;
        } while (local_b0 < local_ac);
      }
      p_Var5 = &(ppVar8->second)._M_h._M_before_begin;
      while (iVar4._M_current = iStack_a0._M_current, p_Var5 = p_Var5->_M_nxt,
            p_Var5 != (__node_base *)0x0) {
        ppVar1 = local_48.
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var5 + 1)].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (__args = local_48.
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var5 + 1)].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; __args != ppVar1;
            __args = __args + 1) {
          iVar3 = *(int *)((long)(p_Var5 + 1) + 4);
          if (__args->second < *(int *)((long)(p_Var5 + 1) + 4)) {
            iVar3 = __args->second;
          }
          if ((local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[__args->first] == 0) && (iVar3 != 0)) {
            if (iStack_a0._M_current == local_98) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&__args->first);
            }
            else {
              *iStack_a0._M_current = __args->first;
              iStack_a0._M_current = iStack_a0._M_current + 1;
            }
          }
          iVar7 = iVar3 + local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[__args->first];
          if (ppVar8->first <
              iVar3 + local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[__args->first]) {
            iVar7 = ppVar8->first;
          }
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[__args->first] = iVar7;
        }
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   (local_48.
                    super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (int)*(size_type *)(p_Var5 + 1)),
                   &local_ac,(int *)((long)(p_Var5 + 1) + 4));
      }
      local_60->pre_candidates_ =
           local_60->pre_candidates_ + ((long)iStack_a0._M_current - (long)local_a8 >> 2);
      for (piVar6 = local_a8; iVar4._M_current != piVar6; piVar6 = piVar6 + 1) {
        local_b0 = *piVar6;
        ppVar2 = (local_50->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((double)((ppVar2[local_b0].first + ppVar2[local_ac].first +
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[local_b0] * -2) / 2) <= local_70) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>(local_58,&local_ac,&local_b0);
        }
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_b0] = 0;
      }
      local_ac = local_ac + 1;
      if (local_a8 != (int *)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != local_68);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: histogram_collection) {
    std::vector<int> pre_candidates;

    // add all small trees that does not have to share a common label in the prefix
    if(histogram.first <= distance_threshold) {
      for(int i = 0; i < current_tree_id; ++i) {
        pre_candidates.push_back(i);
        intersection_cnt[i] += 1;
      }
    }

    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] = std::min((intersection_cnt[il_entry.first] + intersection), histogram.first);
      }
      // add current element to the index
      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((histogram_collection[current_tree_id].first + histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 2 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }
}